

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

SoapySDRArgInfo *
SoapySDRDevice_getChannelSettingInfo
          (SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  size_t *in_stack_00000008;
  exception *ex;
  vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *in_stack_ffffffffffffffb0;
  undefined1 local_40 [32];
  undefined8 local_20;
  undefined4 local_14;
  long *local_10;
  SoapySDRArgInfo *local_8;
  
  *in_RCX = 0;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  (**(code **)(*local_10 + 0x340))(local_40,local_10,local_14,local_20);
  local_8 = toArgInfoList((ArgInfoList *)ex,in_stack_00000008);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            (in_stack_ffffffffffffffb0);
  return local_8;
}

Assistant:

SoapySDRArgInfo *SoapySDRDevice_getChannelSettingInfo(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toArgInfoList(device->getSettingInfo(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}